

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O0

string * __thiscall
cmsys::SystemInformationImplementation::GetProgramStack_abi_cxx11_
          (string *__return_storage_ptr__,SystemInformationImplementation *this,int firstFrame,
          int wholePath)

{
  ostream *this_00;
  string local_a50 [32];
  undefined1 local_a30 [8];
  SymbolProperties symProps;
  int i;
  int nFrames;
  void *stackSymbols [256];
  allocator<char> local_192;
  undefined1 local_191;
  undefined1 local_190 [8];
  ostringstream oss;
  int wholePath_local;
  int firstFrame_local;
  string *programStack;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  local_191 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",&local_192)
  ;
  std::allocator<char>::~allocator(&local_192);
  std::__cxx11::string::operator+=
            ((string *)__return_storage_ptr__,
             "WARNING: The stack trace will not use advanced capabilities because this is a release build.\n"
            );
  symProps._124_4_ = ::backtrace(&i,0x100);
  for (symProps.ReportPath = (int)this; symProps.ReportPath < (int)symProps._124_4_;
      symProps.ReportPath = symProps.ReportPath + 1) {
    anon_unknown_3::SymbolProperties::SymbolProperties((SymbolProperties *)local_a30);
    anon_unknown_3::SymbolProperties::SetReportPath((SymbolProperties *)local_a30,firstFrame);
    anon_unknown_3::SymbolProperties::Initialize
              ((SymbolProperties *)local_a30,*(void **)(&i + (long)symProps.ReportPath * 2));
    this_00 = anon_unknown_3::operator<<((ostream *)local_190,(SymbolProperties *)local_a30);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    anon_unknown_3::SymbolProperties::~SymbolProperties((SymbolProperties *)local_a30);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_a50);
  std::__cxx11::string::~string(local_a50);
  local_191 = 1;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string SystemInformationImplementation::GetProgramStack(int firstFrame,
                                                             int wholePath)
{
  std::ostringstream oss;
  std::string programStack = "";

#ifdef KWSYS_SYSTEMINFORMATION_HAS_DBGHELP
  (void)wholePath;

  void* stack[TRACE_MAX_STACK_FRAMES];
  HANDLE process = GetCurrentProcess();
  SymInitialize(process, NULL, TRUE);
  WORD numberOfFrames =
    CaptureStackBackTrace(firstFrame, TRACE_MAX_STACK_FRAMES, stack, NULL);
  SYMBOL_INFO* symbol = static_cast<SYMBOL_INFO*>(
    malloc(sizeof(SYMBOL_INFO) +
           (TRACE_MAX_FUNCTION_NAME_LENGTH - 1) * sizeof(TCHAR)));
  symbol->MaxNameLen = TRACE_MAX_FUNCTION_NAME_LENGTH;
  symbol->SizeOfStruct = sizeof(SYMBOL_INFO);
  DWORD displacement;
  IMAGEHLP_LINE64 line;
  line.SizeOfStruct = sizeof(IMAGEHLP_LINE64);
  for (int i = 0; i < numberOfFrames; i++) {
    DWORD64 address = reinterpret_cast<DWORD64>(stack[i]);
    SymFromAddr(process, address, NULL, symbol);
    if (SymGetLineFromAddr64(process, address, &displacement, &line)) {
      oss << " at " << symbol->Name << " in " << line.FileName << " line "
          << line.LineNumber << std::endl;
    } else {
      oss << " at " << symbol->Name << std::endl;
    }
  }
  free(symbol);

#else
  programStack += ""
#  if !defined(KWSYS_SYSTEMINFORMATION_HAS_BACKTRACE)
                  "WARNING: The stack could not be examined "
                  "because backtrace is not supported.\n"
#  elif !defined(KWSYS_SYSTEMINFORMATION_HAS_DEBUG_BUILD)
                  "WARNING: The stack trace will not use advanced "
                  "capabilities because this is a release build.\n"
#  else
#    if !defined(KWSYS_SYSTEMINFORMATION_HAS_SYMBOL_LOOKUP)
                  "WARNING: Function names will not be demangled "
                  "because dladdr is not available.\n"
#    endif
#    if !defined(KWSYS_SYSTEMINFORMATION_HAS_CPP_DEMANGLE)
                  "WARNING: Function names will not be demangled "
                  "because cxxabi is not available.\n"
#    endif
#  endif
    ;

#  if defined(KWSYS_SYSTEMINFORMATION_HAS_BACKTRACE)
  void* stackSymbols[256];
  int nFrames = backtrace(stackSymbols, 256);
  for (int i = firstFrame; i < nFrames; ++i) {
    SymbolProperties symProps;
    symProps.SetReportPath(wholePath);
    symProps.Initialize(stackSymbols[i]);
    oss << symProps << std::endl;
  }
#  else
  (void)firstFrame;
  (void)wholePath;
#  endif
#endif

  programStack += oss.str();

  return programStack;
}